

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentQLearner.cpp
# Opt level: O1

Index __thiscall AgentQLearner::getGreedyAction(AgentQLearner *this,Index sI)

{
  Index IVar1;
  _List_node_base *p_Var2;
  int iVar3;
  _Self __tmp;
  _List_node_base *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_ZMM1 [64];
  list<unsigned_int,_std::allocator<unsigned_int>_> actions;
  list<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  auVar6 = in_ZMM1._8_16_;
  local_38.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_38;
  local_38.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_38;
  local_38.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node._M_size = 0
  ;
  getMaxState(this,sI,&local_38);
  iVar3 = rand();
  auVar6 = vcvtusi2sd_avx512f(auVar6,local_38.
                                     super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                     _M_impl._M_node._M_size);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (double)iVar3 * 4.656612873077393e-10 * auVar6._0_8_;
  iVar3 = vcvttsd2usi_avx512f(auVar5);
  p_Var4 = local_38.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
           super__List_node_base._M_next;
  for (; iVar3 != 0; iVar3 = iVar3 + -1) {
    p_Var4 = p_Var4->_M_next;
  }
  IVar1 = *(Index *)&p_Var4[1]._M_next;
  p_Var4 = local_38.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (local_38.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_38) {
    do {
      p_Var2 = p_Var4->_M_next;
      operator_delete(p_Var4,0x18);
      p_Var4 = p_Var2;
    } while (p_Var2 != (_List_node_base *)&local_38);
  }
  return IVar1;
}

Assistant:

Index AgentQLearner::getGreedyAction(Index sI) const
{
    list<Index> actions;
    double d = getMaxState(sI, &actions);

    // count number of other q-values that are equal to the highest value
    // normally count = 1 so iNr will be zero and the highest one is picked
    unsigned iNr = (unsigned)(rand()/(RAND_MAX+1.0)*actions.size());

    list<Index>::const_iterator iter = actions.begin();
    for(unsigned i = 0; i < iNr; i++)
        iter++;

#if DEBUG_AgentQLearner
    cout << "choose greedy action " << *iter << " in state " << sI
         << " with value " << d << endl;
#endif

    return *iter;
}